

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::BaseLineCase::iterate(BaseLineCase *this)

{
  size_type *psVar1;
  ulong uVar2;
  size_t **ppsVar3;
  undefined1 auVar4 [8];
  pointer pSVar5;
  pointer pSVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  undefined4 extraout_var;
  RenderTarget *pRVar11;
  pointer pVVar12;
  ulong *puVar13;
  char *description;
  IterateResult IVar14;
  qpTestResult testResult;
  ulong uVar15;
  char *pcVar16;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> lines;
  Surface resultImage;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  RasterizationArguments args;
  string iterationDescription;
  ScopedLogSection section;
  float range [2];
  pointer local_248;
  pointer pSStack_240;
  pointer local_238 [2];
  Surface local_228;
  long lStack_210;
  undefined1 local_208 [24];
  long lStack_1f0;
  RasterizationArguments local_1e0;
  undefined4 uStack_1cc;
  string local_1c0;
  ScopedLogSection local_1a0;
  undefined1 local_198 [8];
  pointer pSStack_190;
  pointer local_188;
  float local_180;
  ios_base local_128 [264];
  
  iVar8 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::operator<<((ostringstream *)local_198,iVar8 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x1c06ce9);
  pVVar12 = (pointer)(plVar9 + 2);
  if ((pointer)*plVar9 == pVVar12) {
    local_208._16_8_ = *(undefined8 *)pVVar12->m_data;
    lStack_1f0 = plVar9[3];
    local_208._0_8_ = (pointer)(local_208 + 0x10);
  }
  else {
    local_208._16_8_ = *(undefined8 *)pVVar12->m_data;
    local_208._0_8_ = (pointer)*plVar9;
  }
  local_208._8_8_ = plVar9[1];
  *plVar9 = (long)pVVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append(local_208);
  ppsVar3 = (size_t **)&local_228.m_pixels.m_cap;
  puVar13 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar13) {
    local_228.m_pixels.m_cap = *puVar13;
    lStack_210 = plVar9[3];
    local_228._0_8_ = ppsVar3;
  }
  else {
    local_228.m_pixels.m_cap = *puVar13;
    local_228._0_8_ = (ulong *)*plVar9;
  }
  local_228.m_pixels.m_ptr = (void *)plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::operator<<(local_198,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  uVar2 = CONCAT44(local_1e0.greenBits,local_1e0.redBits) + (long)local_228.m_pixels.m_ptr;
  uVar15 = 0xf;
  if ((size_t **)local_228._0_8_ != ppsVar3) {
    uVar15 = local_228.m_pixels.m_cap;
  }
  if (uVar15 < uVar2) {
    uVar15 = 0xf;
    if ((int *)CONCAT44(local_1e0.subpixelBits,local_1e0.numSamples) != &local_1e0.blueBits) {
      uVar15 = CONCAT44(uStack_1cc,local_1e0.blueBits);
    }
    if (uVar2 <= uVar15) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,local_228._0_8_);
      goto LAB_00f6b9f9;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append
                      ((char *)&local_228,CONCAT44(local_1e0.subpixelBits,local_1e0.numSamples));
LAB_00f6b9f9:
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  psVar1 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1c0.field_2._M_allocated_capacity = *psVar1;
    local_1c0.field_2._8_8_ = puVar10[3];
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar1;
    local_1c0._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_1c0._M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((int *)CONCAT44(local_1e0.subpixelBits,local_1e0.numSamples) != &local_1e0.blueBits) {
    operator_delete((undefined1 *)CONCAT44(local_1e0.subpixelBits,local_1e0.numSamples),
                    CONCAT44(uStack_1cc,local_1e0.blueBits) + 1);
  }
  if ((size_t **)local_228._0_8_ != ppsVar3) {
    operator_delete((void *)local_228._0_8_,local_228.m_pixels.m_cap + 1);
  }
  if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
    operator_delete((void *)local_208._0_8_,(ulong)((long)(float *)local_208._16_8_ + 1));
  }
  if (local_248 != (pointer)local_238) {
    operator_delete(local_248,(long)local_238[0] + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1a0,
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log,&local_1c0,&local_1c0);
  iVar8 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_228,iVar8,iVar8);
  local_208._0_8_ = (pointer)0x0;
  local_208._8_8_ = (pointer)0x0;
  local_208._16_8_ = (pointer)0x0;
  local_238[0] = (pointer)0x0;
  local_248 = (pointer)0x0;
  pSStack_240 = (pointer)0x0;
  if ((this->m_primitiveWideness == PRIMITIVEWIDENESS_WIDE) &&
     (this->m_iteration + 1 == this->m_iterationCount)) {
    local_198 = (undefined1  [8])0x0;
    iVar8 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar8) + 0x818))(0x846e,local_198);
    (this->super_BaseRenderingCase).m_lineWidth = (float)local_198._4_4_;
  }
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)(uint)this->m_iteration,local_208,&local_248);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&local_228,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_208,
             this->m_primitiveDrawType);
  local_198 = (undefined1  [8])0x0;
  pSStack_190 = (pointer)0x0;
  local_188 = (pointer)0x0;
  local_1e0.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_1e0.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  pRVar11 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_1e0.redBits = (pRVar11->m_pixelFormat).redBits;
  pRVar11 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_1e0.greenBits = (pRVar11->m_pixelFormat).greenBits;
  pRVar11 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  pSVar6 = local_188;
  pSVar5 = pSStack_190;
  auVar4 = local_198;
  local_1e0.blueBits = (pRVar11->m_pixelFormat).blueBits;
  local_198 = (undefined1  [8])local_248;
  pSStack_190 = pSStack_240;
  local_188 = local_238[0];
  local_248 = (pointer)auVar4;
  pSStack_240 = pSVar5;
  local_238[0] = pSVar6;
  local_180 = (this->super_BaseRenderingCase).m_lineWidth;
  bVar7 = tcu::verifyLineGroupRasterization
                    (&local_228,(LineSceneSpec *)local_198,&local_1e0,
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log);
  if (((this->super_BaseRenderingCase).m_numSamples < 2 || bVar7) || local_180 == 1.0) {
    if (!bVar7) {
      this->m_allIterationsPassed = false;
    }
  }
  else {
    this->m_multisampleRelaxationRequired = true;
  }
  if (local_198 != (undefined1  [8])0x0) {
    operator_delete((void *)local_198,(long)local_188 - (long)local_198);
  }
  iVar8 = this->m_iteration + 1;
  this->m_iteration = iVar8;
  IVar14 = CONTINUE;
  if (iVar8 == this->m_iterationCount) {
    pcVar16 = "Pass";
    if ((this->m_multisampleRelaxationRequired & 1U) != 0) {
      pcVar16 = "Rasterization of multisampled wide lines failed";
    }
    bVar7 = this->m_allIterationsPassed != false;
    testResult = QP_TEST_RESULT_FAIL;
    if (bVar7) {
      testResult = (this->m_multisampleRelaxationRequired & 1) * 3;
    }
    description = "Incorrect rasterization";
    if (bVar7) {
      description = pcVar16;
    }
    IVar14 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,testResult,description);
  }
  if (local_248 != (pointer)0x0) {
    operator_delete(local_248,(long)local_238[0] - (long)local_248);
  }
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ - local_208._0_8_);
  }
  tcu::Surface::~Surface(&local_228);
  tcu::TestLog::endSection(local_1a0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  return IVar14;
}

Assistant:

BaseLineCase::IterateResult BaseLineCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// last iteration, max out size
	if (m_primitiveWideness == PRIMITIVEWIDENESS_WIDE &&
		m_iteration+1 == m_iterationCount)
	{
		float range[2] = { 0.0f, 0.0f };
		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_LINE_WIDTH_RANGE, range);

		m_lineWidth = range[1];
	}

	// gen data
	generateLines(m_iteration, drawBuffer, lines);

	// draw image
	drawPrimitives(resultImage, drawBuffer, m_primitiveDrawType);

	// compare
	{
		bool					compareOk;
		RasterizationArguments	args;
		LineSceneSpec			scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.lines.swap(lines);
		scene.lineWidth = m_lineWidth;

		compareOk = verifyLineGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

		// multisampled wide lines might not be supported
		if (scene.lineWidth != 1.0f && m_numSamples > 1 && !compareOk)
		{
			m_multisampleRelaxationRequired = true;
			compareOk = true;
		}

		if (!compareOk)
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed && m_multisampleRelaxationRequired)
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Rasterization of multisampled wide lines failed");
		else if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}